

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::setClearButtonEnabled(QLineEdit *this,bool enable)

{
  QLineEditPrivate *this_00;
  long lVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QWidget *pQVar2;
  QAction *action;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  lVar1 = qt_qFindChild_helper
                    (this,"_q_qlineeditclearaction",0x4000000000000017,&QAction::staticMetaObject,1)
  ;
  if ((lVar1 != 0) != enable) {
    if (enable) {
      this_01.m_data = operator_new(0x10);
      QLineEditPrivate::clearButtonIcon((QLineEditPrivate *)&stack0xffffffffffffffc0);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      QAction::QAction((QAction *)this_01.m_data_utf8,(QIcon *)&stack0xffffffffffffffc0,
                       (QString *)&local_58,(QObject *)this);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon((QIcon *)&stack0xffffffffffffffc0);
      QAction::setEnabled(this_01._0_1_);
      QVar3.m_size = (size_t)"_q_qlineeditclearaction";
      QVar3.field_0.m_data = this_01.m_data;
      QObject::setObjectName(QVar3);
      pQVar2 = QLineEditPrivate::addAction
                         (this_00,(QAction *)this_01.m_data_utf8,(QAction *)0x0,TrailingPosition,5);
      QWidgetLineControl::text
                (&local_58,*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600)
                );
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,local_58.d.size != 0);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      action = (QAction *)
               qt_qFindChild_helper
                         (this,"_q_qlineeditclearaction",0x4000000000000017,
                          &QAction::staticMetaObject,1);
      QLineEditPrivate::removeAction(this_00,action);
      if (action != (QAction *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)action + 0x20))(action);
          return;
        }
        goto LAB_00418373;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00418373:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setClearButtonEnabled(bool enable)
{
#if QT_CONFIG(action)
    Q_D(QLineEdit);
    if (enable == isClearButtonEnabled())
        return;
    if (enable) {
        QAction *clearAction = new QAction(d->clearButtonIcon(), QString(), this);
        clearAction->setEnabled(!isReadOnly());
        clearAction->setObjectName(QLatin1StringView(clearButtonActionNameC));

        int flags = QLineEditPrivate::SideWidgetClearButton | QLineEditPrivate::SideWidgetFadeInWithText;
        auto widgetAction = d->addAction(clearAction, nullptr, QLineEdit::TrailingPosition, flags);
        widgetAction->setVisible(!text().isEmpty());
    } else {
        QAction *clearAction = findChild<QAction *>(QLatin1StringView(clearButtonActionNameC));
        Q_ASSERT(clearAction);
        d->removeAction(clearAction);
        delete clearAction;
    }
#else
    Q_UNUSED(enable);
#endif // QT_CONFIG(action)
}